

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_coded_block_flag(bitstream *str,h264_cabac_context *cabac,int cat,int idx,uint32_t *val)

{
  int iVar1;
  h264_macroblock *phVar2;
  h264_macroblock *mb;
  h264_macroblock *phVar3;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_R8;
  int ctxIdx;
  int condTermFlagB;
  int condTermFlagA;
  int idxB;
  int idxA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  int which;
  int inter;
  h264_macroblock *mbT;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  h264_mb_pos in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int iVar4;
  int idx_00;
  int inter_00;
  h264_block_size bs;
  h264_mb_pos pos;
  
  phVar2 = h264_mb_nb_p((h264_slice *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (h264_mb_pos)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                        (int)in_stack_ffffffffffffffa0);
  iVar1 = h264_is_inter_mb_type(phVar2->mb_type);
  mb = (h264_macroblock *)(ulong)in_EDX;
  switch(mb) {
  case (h264_macroblock *)0x0:
  case (h264_macroblock *)0x1:
  case (h264_macroblock *)0x2:
  case (h264_macroblock *)0x5:
    iVar4 = 0;
    break;
  case (h264_macroblock *)0x3:
    iVar4 = in_ECX + 1;
    break;
  case (h264_macroblock *)0x4:
    iVar4 = ((int)in_ECX >> 3) + 1;
    in_ECX = in_ECX & 7;
    break;
  case (h264_macroblock *)0x6:
  case (h264_macroblock *)0x7:
  case (h264_macroblock *)0x8:
  case (h264_macroblock *)0x9:
    iVar4 = 1;
    break;
  case (h264_macroblock *)0xa:
  case (h264_macroblock *)0xb:
  case (h264_macroblock *)0xc:
  case (h264_macroblock *)0xd:
    iVar4 = 2;
    break;
  default:
    abort();
  }
  idx_00 = (int)phVar2;
  inter_00 = (int)((ulong)phVar2 >> 0x20);
  bs = (h264_block_size)in_R8;
  pos = (h264_mb_pos)((ulong)in_R8 >> 0x20);
  switch(in_EDX) {
  case 0:
  case 3:
  case 6:
  case 10:
    h264_mb_nb((h264_slice *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    h264_mb_nb((h264_slice *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffbc = 0x10;
    in_stack_ffffffffffffffb8 = 0x10;
    break;
  case 1:
  case 2:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
    h264_mb_nb_b((h264_slice *)CONCAT44(in_EDX,in_ECX),pos,bs,inter_00,idx_00,
                 (int *)CONCAT44(iVar1,iVar4));
    h264_mb_nb_b((h264_slice *)CONCAT44(in_EDX,in_ECX),(h264_mb_pos)((ulong)in_R8 >> 0x20),
                 (h264_block_size)in_R8,(int)((ulong)phVar2 >> 0x20),(int)phVar2,
                 (int *)CONCAT44(iVar1,iVar4));
    break;
  case 4:
    h264_mb_nb_b((h264_slice *)CONCAT44(in_EDX,in_ECX),pos,bs,inter_00,idx_00,
                 (int *)CONCAT44(iVar1,iVar4));
    h264_mb_nb_b((h264_slice *)CONCAT44(in_EDX,in_ECX),(h264_mb_pos)((ulong)in_R8 >> 0x20),
                 (h264_block_size)in_R8,(int)((ulong)phVar2 >> 0x20),(int)phVar2,
                 (int *)CONCAT44(iVar1,iVar4));
    break;
  case 5:
  case 9:
  case 0xd:
    phVar3 = h264_mb_nb_b((h264_slice *)CONCAT44(in_EDX,in_ECX),pos,bs,inter_00,idx_00,
                          (int *)CONCAT44(iVar1,iVar4));
    phVar2 = h264_mb_nb_b((h264_slice *)CONCAT44(in_EDX,in_ECX),(h264_mb_pos)((ulong)in_R8 >> 0x20),
                          (h264_block_size)in_R8,(int)((ulong)phVar2 >> 0x20),(int)phVar2,
                          (int *)CONCAT44(iVar1,iVar4));
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc << 2;
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 << 2;
    if (((phVar3->transform_size_8x8_flag == 0) && (phVar3->mb_type != 0x19)) &&
       (phVar3->mb_type != 0x39)) {
      h264_mb_unavail(1);
    }
    if (((phVar2->transform_size_8x8_flag == 0) && (phVar2->mb_type != 0x19)) &&
       (phVar2->mb_type != 0x39)) {
      h264_mb_unavail(1);
    }
    break;
  default:
    abort();
  }
  phVar2 = h264_inter_filter((h264_slice *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),mb,0);
  phVar3 = h264_inter_filter((h264_slice *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),mb,0);
  iVar1 = phVar2->coded_block_flag[iVar4][in_stack_ffffffffffffffbc];
  iVar4 = phVar3->coded_block_flag[iVar4][in_stack_ffffffffffffffb8];
  iVar1 = h264_cabac_decision((bitstream *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (h264_cabac_context *)CONCAT44(iVar1,iVar4),
                              h264_coded_block_flag::basectx[(int)in_EDX] + iVar1 + iVar4 * 2,
                              &mb->mb_field_decoding_flag);
  return iVar1;
}

Assistant:

int h264_coded_block_flag(struct bitstream *str, struct h264_cabac_context *cabac, int cat, int idx, uint32_t *val) {
	static const int basectx[14] = {
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT0,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT1,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT2,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT3,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT4,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT5,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT6,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT7,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT8,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT9,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT10,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT11,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT12,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT13,
	};
	const struct h264_macroblock *mbT = h264_mb_nb_p(cabac->slice, H264_MB_THIS, 0);
	int inter = h264_is_inter_mb_type(mbT->mb_type);
	int which;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_LUMA_8X8:
			which = 0;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CB_8X8:
			which = 1;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CR_8X8:
			which = 2;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			which = idx + 1;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			which = (idx >> 3) + 1;
			idx &= 7;
			break;
		default:
			abort();
	}
	const struct h264_macroblock *mbA;
	const struct h264_macroblock *mbB;
	int idxA;
	int idxB;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mbA = h264_mb_nb(cabac->slice, H264_MB_A, inter);
			mbB = h264_mb_nb(cabac->slice, H264_MB_B, inter);
			idxA = 16;
			idxB = 16;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_4X4, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_4X4, inter, idx, &idxB);
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
		case H264_CTXBLOCKCAT_CB_8X8:
		case H264_CTXBLOCKCAT_CR_8X8:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, inter, idx, &idxB);
			idxA *= 4;
			idxB *= 4;
			if (!mbA->transform_size_8x8_flag && mbA->mb_type != H264_MB_TYPE_I_PCM && mbA->mb_type != H264_MB_TYPE_UNAVAIL)
				mbA = h264_mb_unavail(1);;
			if (!mbB->transform_size_8x8_flag && mbB->mb_type != H264_MB_TYPE_I_PCM && mbB->mb_type != H264_MB_TYPE_UNAVAIL)
				mbB = h264_mb_unavail(1);;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_CHROMA, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_CHROMA, inter, idx, &idxB);
			break;
		default:
			abort();
	}
	mbA = h264_inter_filter(cabac->slice, mbA, inter);
	mbB = h264_inter_filter(cabac->slice, mbB, inter);
	int condTermFlagA = mbA->coded_block_flag[which][idxA];
	int condTermFlagB = mbB->coded_block_flag[which][idxB];
	int ctxIdx = basectx[cat] + condTermFlagA + condTermFlagB * 2;
	return h264_cabac_decision(str, cabac, ctxIdx, val);
}